

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

DataAddress * __thiscall
Rml::DataExpressionInterface::ParseAddress
          (DataAddress *__return_storage_ptr__,DataExpressionInterface *this,String *address_str)

{
  initializer_list<Rml::DataAddressEntry> __l;
  ulong uVar1;
  char *pcVar2;
  DataAddressEntry *local_120;
  allocator<Rml::DataAddressEntry> local_e2;
  undefined1 local_e1;
  String local_e0;
  allocator<char> local_a9;
  String local_a8;
  DataAddressEntry *local_88;
  DataAddressEntry local_80;
  DataAddressEntry local_58;
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  String *address_str_local;
  DataExpressionInterface *this_local;
  
  local_20 = (undefined1  [8])address_str;
  address_str_local = (String *)this;
  this_local = (DataExpressionInterface *)__return_storage_ptr__;
  uVar1 = ::std::__cxx11::string::size();
  if ((((uVar1 < 4) ||
       (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)local_20), *pcVar2 != 'e')) ||
      (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)local_20), *pcVar2 != 'v')) ||
     (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)local_20), *pcVar2 != '.')) {
    if (this->data_model == (DataModel *)0x0) {
      memset(__return_storage_ptr__,0,0x18);
      ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
                (__return_storage_ptr__);
    }
    else {
      DataModel::ResolveAddress
                (__return_storage_ptr__,this->data_model,(String *)local_20,this->element);
    }
  }
  else {
    local_e1 = 1;
    local_88 = &local_80;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"ev",&local_a9);
    DataAddressEntry::DataAddressEntry(&local_80,&local_a8);
    local_88 = &local_58;
    ::std::__cxx11::string::substr((ulong)&local_e0,(ulong)local_20);
    DataAddressEntry::DataAddressEntry(&local_58,&local_e0);
    local_e1 = 0;
    local_30 = &local_80;
    local_28 = 2;
    ::std::allocator<Rml::DataAddressEntry>::allocator(&local_e2);
    __l._M_len = local_28;
    __l._M_array = local_30;
    ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
              (__return_storage_ptr__,__l,&local_e2);
    ::std::allocator<Rml::DataAddressEntry>::~allocator(&local_e2);
    local_120 = (DataAddressEntry *)&local_30;
    do {
      local_120 = local_120 + -1;
      DataAddressEntry::~DataAddressEntry(local_120);
    } while (local_120 != &local_80);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::allocator<char>::~allocator(&local_a9);
  }
  return __return_storage_ptr__;
}

Assistant:

DataAddress DataExpressionInterface::ParseAddress(const String& address_str) const
{
	if (address_str.size() >= 4 && address_str[0] == 'e' && address_str[1] == 'v' && address_str[2] == '.')
		return DataAddress{DataAddressEntry("ev"), DataAddressEntry(address_str.substr(3))};

	return data_model ? data_model->ResolveAddress(address_str, element) : DataAddress();
}